

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_label.cc
# Opt level: O0

void no_label::print_no_label_update(vw *all,example *ec)

{
  long *in_RDI;
  float in_stack_000003d8;
  bool in_stack_000003df;
  size_t in_stack_000003e0;
  float in_stack_000003e8;
  float in_stack_000003ec;
  size_t in_stack_000003f0;
  bool in_stack_000003ff;
  shared_data *in_stack_00000400;
  
  if ((((double)*(float *)(*in_RDI + 0x50) <=
        *(double *)(*in_RDI + 0x20) + *(double *)(*in_RDI + 0x30)) &&
      ((*(byte *)((long)in_RDI + 0x3439) & 1) == 0)) && ((*(byte *)((long)in_RDI + 0x9c) & 1) == 0))
  {
    shared_data::print_update
              (in_stack_00000400,in_stack_000003ff,in_stack_000003f0,in_stack_000003ec,
               in_stack_000003e8,in_stack_000003e0,in_stack_000003df,in_stack_000003d8);
  }
  return;
}

Assistant:

void print_no_label_update(vw& all, example& ec)
{
  if (all.sd->weighted_labeled_examples + all.sd->weighted_unlabeled_examples >= all.sd->dump_interval && !all.quiet &&
      !all.bfgs)
  {
    all.sd->print_update(all.holdout_set_off, all.current_pass, 0.f, ec.pred.scalar, ec.num_features, all.progress_add,
        all.progress_arg);
  }
}